

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void dfst(int n,double *a,double *t,int *ip,double *w)

{
  double *c;
  double dVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int nc;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar4 = (ulong)(uint)n;
  iVar12 = *ip;
  if (iVar12 * 8 < n) {
    iVar12 = n >> 3;
    makewt(iVar12,ip,w);
  }
  nc = ip[1];
  if (nc * 2 < n) {
    nc = n >> 1;
    makect(nc,ip,w + iVar12);
  }
  if (n < 3) goto LAB_0010bbfb;
  uVar13 = (uint)n >> 1;
  uVar5 = (ulong)uVar13;
  uVar7 = (ulong)((uint)n >> 2);
  if (7 < (uint)n) {
    lVar6 = 1;
    lVar8 = -uVar5;
    lVar9 = uVar5 * 8 + -8;
    lVar11 = 0;
    do {
      lVar8 = lVar8 + 1;
      dVar15 = *(double *)((long)a + lVar11 + uVar4 * 8 + -8);
      dVar14 = a[lVar6] - dVar15;
      dVar1 = *(double *)((long)a + lVar11 + lVar9);
      dVar2 = a[uVar4 + lVar8];
      dVar16 = dVar1 - dVar2;
      a[lVar6] = a[lVar6] + dVar15;
      *(double *)((long)a + lVar11 + lVar9) = dVar1 + dVar2;
      t[lVar6] = dVar14 + dVar16;
      *(double *)((long)t + lVar11 + uVar5 * 8 + -8) = dVar14 - dVar16;
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + -8;
    } while (uVar7 * 8 + -8 + lVar11 != 0);
  }
  iVar3 = n - ((uint)n >> 2);
  *t = a[uVar7] - a[iVar3];
  a[uVar7] = a[iVar3] + a[uVar7];
  *a = a[uVar5];
  c = w + iVar12;
  dstsub(uVar13,a,nc,c);
  if ((uint)n < 10) {
    if (uVar13 == 4) {
      cftfsub(4,a,w);
    }
  }
  else {
    bitrv2(uVar13,ip + 2,a);
    cftfsub(uVar13,a,w);
    rftfsub(uVar13,a,nc,c);
  }
  a[uVar4 - 1] = a[1] - *a;
  a[1] = *a + a[1];
  if ((uint)n < 8) {
LAB_0010bbd2:
    dVar15 = *t;
    lVar8 = 2;
  }
  else {
    uVar4 = (ulong)((uint)n >> 1) + 2;
    lVar8 = (ulong)((uint)n >> 1) << 3;
    do {
      dVar15 = a[uVar4 - 4];
      *(double *)((long)a + lVar8 * 2 + -0x18) = dVar15 - a[uVar4 - 3];
      *(double *)((long)a + lVar8 * 2 + -0x28) = -dVar15 - a[uVar4 - 3];
      uVar4 = uVar4 - 2;
      lVar8 = lVar8 + -0x10;
    } while (5 < uVar4);
    if ((uint)n < 8) goto LAB_0010bbd2;
    iVar12 = 2;
    do {
      iVar3 = iVar12;
      uVar13 = (uint)uVar7;
      dstsub(uVar13,t,nc,c);
      if (uVar13 < 5) {
        if (uVar13 == 4) {
          cftfsub(4,t,w);
        }
      }
      else {
        bitrv2(uVar13,ip + 2,t);
        cftfsub(uVar13,t,w);
        rftfsub(uVar13,t,nc,c);
      }
      a[n - iVar3] = t[1] - *t;
      lVar8 = (long)iVar3;
      a[lVar8] = *t + t[1];
      if (uVar13 < 3) {
        iVar12 = (int)(uVar7 >> 1);
LAB_0010bbe5:
        dVar15 = t[iVar12 + uVar13];
        *t = dVar15;
        break;
      }
      uVar4 = 2;
      lVar9 = (long)(iVar3 * 4);
      do {
        a[lVar9 - lVar8] = -t[uVar4] - t[uVar4 + 1];
        a[lVar8 + lVar9] = t[uVar4] - t[uVar4 + 1];
        uVar4 = uVar4 + 2;
        lVar9 = lVar9 + iVar3 * 4;
      } while (uVar4 < uVar7);
      uVar4 = uVar7 >> 1;
      iVar12 = (int)uVar4;
      if (uVar13 == 3) goto LAB_0010bbe5;
      lVar8 = uVar7 << 4;
      uVar10 = 1;
      uVar5 = uVar7;
      do {
        uVar5 = uVar5 - 1;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + -8;
        dVar15 = t[uVar7];
        t[uVar10] = *(double *)((long)t + lVar8) + dVar15;
        t[uVar5] = *(double *)((long)t + lVar8) - dVar15;
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
      dVar15 = t[iVar12 + uVar13];
      *t = dVar15;
      uVar7 = uVar4;
      iVar12 = iVar3 * 2;
    } while (uVar13 != 3);
    lVar8 = (long)(iVar3 * 2);
  }
  a[lVar8] = dVar15;
LAB_0010bbfb:
  *a = 0.0;
  return;
}

Assistant:

void dfst(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    if (n > 2) {
        m = n >> 1;
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] + a[n - j];
            xi = a[j] - a[n - j];
            yr = a[k] + a[n - k];
            yi = a[k] - a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi + yi;
            t[k] = xi - yi;
        }
        t[0] = a[mh] - a[n - mh];
        a[mh] += a[n - mh];
        a[0] = a[m];
        dstsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[1] - a[0];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] - a[j + 1];
            a[2 * j - 1] = -a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dstsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[1] - t[0];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = -t[j] - t[j + 1];
                a[k + l] = t[j] - t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 1; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] + t[m + j];
                t[k] = t[m + k] - t[m + j];
            }
            t[0] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
    }
    a[0] = 0;
}